

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

bool Catch::operator==(ProcessedReporterSpec *lhs,ProcessedReporterSpec *rhs)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  
  sVar1 = (lhs->name)._M_string_length;
  if (sVar1 == (rhs->name)._M_string_length) {
    if ((sVar1 != 0) &&
       (iVar3 = bcmp((lhs->name)._M_dataplus._M_p,(rhs->name)._M_dataplus._M_p,sVar1), iVar3 != 0))
    {
      return false;
    }
    sVar1 = (lhs->outputFilename)._M_string_length;
    if (sVar1 == (rhs->outputFilename)._M_string_length) {
      if ((sVar1 != 0) &&
         (iVar3 = bcmp((lhs->outputFilename)._M_dataplus._M_p,(rhs->outputFilename)._M_dataplus._M_p
                       ,sVar1), iVar3 != 0)) {
        return false;
      }
      if ((lhs->colourMode == rhs->colourMode) &&
         ((lhs->customOptions)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
          (rhs->customOptions)._M_t._M_impl.super__Rb_tree_header._M_node_count)) {
        bVar2 = std::__equal<false>::
                equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          ((lhs->customOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                           ,(_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )&(lhs->customOptions)._M_t._M_impl.super__Rb_tree_header,
                           (rhs->customOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                          );
        return bVar2;
      }
    }
  }
  return false;
}

Assistant:

void Capturer::captureValue( size_t index, std::string const& value ) {
        assert( index < m_messages.size() );
        m_messages[index].message += value;
        m_resultCapture.pushScopedMessage( m_messages[index] );
        m_captured++;
    }